

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

int nifti_is_inttype(int dt)

{
  if (dt < 0x200) {
    if (dt < 8) {
      if (dt == 2) {
        return 1;
      }
      if (dt == 4) {
        return 1;
      }
    }
    else if (((dt == 8) || (dt == 0x80)) || (dt == 0x100)) {
      return 1;
    }
  }
  else if (dt < 0x400) {
    if (dt == 0x200) {
      return 1;
    }
    if (dt == 0x300) {
      return 1;
    }
  }
  else {
    if (dt == 0x400) {
      return 1;
    }
    if (dt == 0x500) {
      return 1;
    }
    if (dt == 0x900) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int nifti_is_inttype( int dt )
{
   switch( dt ){
     case DT_UNKNOWN:    return 0 ;
     case DT_BINARY:     return 0 ;
     case DT_INT8:       return 1 ;
     case DT_UINT8:      return 1 ;
     case DT_INT16:      return 1 ;
     case DT_UINT16:     return 1 ;
     case DT_INT32:      return 1 ;
     case DT_UINT32:     return 1 ;
     case DT_INT64:      return 1 ;
     case DT_UINT64:     return 1 ;
     case DT_FLOAT32:    return 0 ;
     case DT_FLOAT64:    return 0 ;
     case DT_FLOAT128:   return 0 ;
     case DT_COMPLEX64:  return 0 ;
     case DT_COMPLEX128: return 0 ;
     case DT_COMPLEX256: return 0 ;
     case DT_RGB24:      return 1 ;
     case DT_RGBA32:     return 1 ;
   }
   return 0 ;
}